

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_tointg(ASMState *as,IRIns *ir,Reg left)

{
  Reg r2;
  Reg r2_00;
  MCode *pMVar1;
  uint uVar2;
  
  r2 = ra_scratch(as,~(1 << (left & 0x1f)) & 0xffff0000);
  r2_00 = ra_dest(as,ir,0xffef);
  asm_guardcc(as,10);
  asm_guardcc(as,5);
  emit_rr(as,XO_UCOMISD,left,r2);
  emit_rr(as,XO_CVTSI2SD,r2,r2_00);
  pMVar1 = as->mcp;
  pMVar1[-1] = ((byte)r2 & 7) + (byte)r2 * '\b' | 0xc0;
  pMVar1[-3] = '\x0f';
  pMVar1[-2] = 'W';
  uVar2 = r2 >> 3 & 1 | r2 >> 1 & 4;
  if (uVar2 == 0) {
    pMVar1 = pMVar1 + -3;
  }
  else {
    pMVar1[-4] = (byte)uVar2 | 0x40;
    pMVar1 = pMVar1 + -4;
  }
  as->mcp = pMVar1;
  if (as->mclim <= pMVar1) {
    emit_rr(as,XO_CVTTSD2SI,r2_00,left);
    return;
  }
  asm_mclimit(as);
}

Assistant:

static void asm_tointg(ASMState *as, IRIns *ir, Reg left)
{
  Reg tmp = ra_scratch(as, rset_exclude(RSET_FPR, left));
  Reg dest = ra_dest(as, ir, RSET_GPR);
  asm_guardcc(as, CC_P);
  asm_guardcc(as, CC_NE);
  emit_rr(as, XO_UCOMISD, left, tmp);
  emit_rr(as, XO_CVTSI2SD, tmp, dest);
  emit_rr(as, XO_XORPS, tmp, tmp);  /* Avoid partial register stall. */
  checkmclim(as);
  emit_rr(as, XO_CVTTSD2SI, dest, left);
  /* Can't fuse since left is needed twice. */
}